

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

void __thiscall amrex::ClusterList::boxList(ClusterList *this,BoxList *blst)

{
  pointer *ppBVar1;
  Box *__args;
  iterator __position;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  const_iterator End;
  _List_node_base *p_Var5;
  
  BoxList::clear(blst);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::reserve
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)blst,
             (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
             _M_impl._M_node._M_size);
  for (p_Var5 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
                _M_impl._M_node.super__List_node_base._M_next; p_Var5 != (_List_node_base *)this;
      p_Var5 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var5->_M_next)->
               super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
               _M_node.super__List_node_base._M_next) {
    __args = *(Box **)&((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)(p_Var5 + 1))->
                       super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>;
    __position._M_current =
         (blst->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (blst->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)blst,__position,__args);
    }
    else {
      uVar2 = *(undefined8 *)(__args->smallend).vect;
      uVar3 = *(undefined8 *)((__args->smallend).vect + 2);
      uVar4 = *(undefined8 *)((__args->bigend).vect + 2);
      *(undefined8 *)((__position._M_current)->bigend).vect = *(undefined8 *)(__args->bigend).vect;
      *(undefined8 *)(((__position._M_current)->bigend).vect + 2) = uVar4;
      *(undefined8 *)((__position._M_current)->smallend).vect = uVar2;
      *(undefined8 *)(((__position._M_current)->smallend).vect + 2) = uVar3;
      ppBVar1 = &(blst->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void
ClusterList::boxList (BoxList& blst) const
{
    blst.clear();
    blst.reserve(lst.size());
    for (std::list<Cluster*>::const_iterator cli = lst.begin(), End = lst.end();
         cli != End;
         ++cli)
    {
        blst.push_back((*cli)->box());
    }
}